

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udataswp.cpp
# Opt level: O1

int32_t udata_swapInvStringBlock_63
                  (UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode
                  )

{
  bool bVar1;
  int32_t iVar2;
  uint uVar3;
  
  iVar2 = 0;
  if ((pErrorCode != (UErrorCode *)0x0) && (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if ((length < 0 || (inData == (void *)0x0 || ds == (UDataSwapper *)0x0)) ||
       (0 < length && outData == (void *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      uVar3 = length;
      if (0 < length) {
        do {
          if (*(char *)((long)inData + ((ulong)uVar3 - 1)) == '\0') goto LAB_002ddd38;
          bVar1 = 1 < (int)uVar3;
          uVar3 = uVar3 - 1;
        } while (bVar1);
        uVar3 = 0;
      }
LAB_002ddd38:
      (*ds->swapInvChars)(ds,inData,uVar3,outData,pErrorCode);
      if ((length - uVar3 != 0 && (int)uVar3 <= length) && inData != outData) {
        memcpy((void *)((long)outData + (ulong)uVar3),(void *)((long)inData + (ulong)uVar3),
               (long)(int)(length - uVar3));
      }
      iVar2 = length;
      if (U_ZERO_ERROR < *pErrorCode) {
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

U_CAPI int32_t U_EXPORT2
udata_swapInvStringBlock(const UDataSwapper *ds,
                         const void *inData, int32_t length, void *outData,
                         UErrorCode *pErrorCode) {
    const char *inChars;
    int32_t stringsLength;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(ds==NULL || inData==NULL || length<0 || (length>0 && outData==NULL)) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    /* reduce the strings length to not include bytes after the last NUL */
    inChars=(const char *)inData;
    stringsLength=length;
    while(stringsLength>0 && inChars[stringsLength-1]!=0) {
        --stringsLength;
    }

    /* swap up to the last NUL */
    ds->swapInvChars(ds, inData, stringsLength, outData, pErrorCode);

    /* copy the bytes after the last NUL */
    if(inData!=outData && length>stringsLength) {
        uprv_memcpy((char *)outData+stringsLength, inChars+stringsLength, length-stringsLength);
    }

    /* return the length including padding bytes */
    if(U_SUCCESS(*pErrorCode)) {
        return length;
    } else {
        return 0;
    }
}